

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
::operator=(result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
            *this,result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                  *other)

{
  bool bVar1;
  value_type *v;
  error_type *v_00;
  failure_type *tmp_1;
  success_type *tmp;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  *other_local;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  *this_local;
  
  cleanup(this,(EVP_PKEY_CTX *)other);
  bVar1 = is_ok(other);
  if (bVar1) {
    v = as_ok(other);
    success<toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>::success
              (&(this->field_1).succ,v);
  }
  else {
    v_00 = as_err(other);
    failure<toml::detail::none_t>::failure
              ((failure<toml::detail::none_t> *)&(this->field_1).succ,v_00);
  }
  bVar1 = is_ok(other);
  this->is_ok_ = bVar1;
  return this;
}

Assistant:

result& operator=(result&& other)
    {
        this->cleanup();
        if(other.is_ok())
        {
            auto tmp = ::new(std::addressof(this->succ)) success_type(std::move(other.as_ok()));
            assert(tmp == std::addressof(this->succ));
            (void)tmp;
        }
        else
        {
            auto tmp = ::new(std::addressof(this->fail)) failure_type(std::move(other.as_err()));
            assert(tmp == std::addressof(this->fail));
            (void)tmp;
        }
        is_ok_ = other.is_ok();
        return *this;
    }